

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void roaring_bitmap_add_bulk(roaring_bitmap_t *r,roaring_bulk_context_t *context,uint32_t val)

{
  undefined8 in_RSI;
  roaring_bulk_context_t *in_RDI;
  undefined4 unaff_retaddr;
  
  add_bulk_impl((roaring_bitmap_t *)CONCAT44(val,unaff_retaddr),in_RDI,
                (uint32_t)((ulong)in_RSI >> 0x20));
  return;
}

Assistant:

void roaring_bitmap_add_bulk(roaring_bitmap_t *r,
                             roaring_bulk_context_t *context, uint32_t val) {
    add_bulk_impl(r, context, val);
}